

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O1

uint32_t __thiscall ans_msb_decode::decode_sym(ans_msb_decode *this,uint64_t *state,uint8_t **in_u8)

{
  pointer pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  
  pdVar1 = (this->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
           super__Vector_impl_data._M_start + (this->frame_mask & *state);
  uVar6 = (ulong)pdVar1->offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar1->freq;
  *state = uVar6;
  if (uVar6 < this->lower_bound) {
    puVar5 = *in_u8;
    *in_u8 = puVar5 + -4;
    *state = (ulong)*(uint *)(puVar5 + -4) | uVar6 << 0x20;
  }
  uVar2 = pdVar1->mapped_num;
  uVar6 = (ulong)(uVar2 >> 0x1e);
  uVar3 = *(uint *)(ans_msb_undo_mapping(dec_entry_msb_const&,unsigned_char_const*&)::except_mask +
                   uVar6 * 4);
  uVar4 = *(uint *)(*in_u8 + -uVar6);
  *in_u8 = *in_u8 + -uVar6;
  return (uVar3 & uVar4) + (uVar2 & 0x3fffffff);
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_msb_undo_mapping(entry, in_u8);
        return decoded_sym;
    }